

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

char * mk_filename(uint32 type,char *rel_path)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *local_30;
  char *tt;
  char *e;
  char *r;
  char *rel_path_local;
  uint32 type_local;
  
  pcVar1 = data_dir[type];
  pcVar3 = extension[type];
  local_30 = rel_path;
  if ((pcVar1 == (char *)0x0) || (pcVar3 == (char *)0x0)) {
    if (pcVar1 == (char *)0x0) {
      if (pcVar3 == (char *)0x0) {
        strcpy(mk_filename::fn,rel_path);
      }
      else {
        sprintf(mk_filename::fn,"%s.%s",rel_path,pcVar3);
      }
    }
    else if (is_flat[type] == 0) {
      sprintf(mk_filename::fn,"%s/%s",pcVar1,rel_path);
    }
    else {
      pcVar3 = strrchr(rel_path,0x2f);
      if (pcVar3 != (char *)0x0) {
        local_30 = pcVar3 + 1;
      }
      sprintf(mk_filename::fn,"%s/%s",pcVar1,local_30);
    }
  }
  else if (is_flat[type] == 0) {
    sprintf(mk_filename::fn,"%s/%s.%s",pcVar1,rel_path,pcVar3);
  }
  else {
    pcVar2 = strrchr(rel_path,0x2f);
    if (pcVar2 != (char *)0x0) {
      local_30 = pcVar2 + 1;
    }
    sprintf(mk_filename::fn,"%s/%s.%s",pcVar1,local_30,pcVar3);
  }
  return mk_filename::fn;
}

Assistant:

static char *
mk_filename(uint32 type, char *rel_path)
{
    static char fn[MAXPATHLEN];
    const char *r;
    const char *e;
    char *tt;

    r = data_dir[type];
    e = extension[type];
    
    if (r && e) {
	if (is_flat[type] == FALSE) {
	    sprintf(fn, "%s/%s.%s",
		    r, rel_path, e);
	}
	else {
	    tt = strrchr(rel_path, '/');
	    if (tt) {
		++tt;
	    }
	    else {
		tt = rel_path;
	    }
	    sprintf(fn, "%s/%s.%s",  r, tt, e);
	}
    }
    else if (r) {
	if (is_flat[type] == FALSE) {
	    sprintf(fn, "%s/%s",
		    r, rel_path);
	}
	else {
	    tt = strrchr(rel_path, '/');
	    if (tt) {
		++tt;
	    }
	    else {
		tt = rel_path;
	    }
	    sprintf(fn, "%s/%s",  r, tt);
	}
    }
    else if (e) {
	sprintf(fn, "%s.%s",
		rel_path, e);
    }
    else {
	strcpy(fn, rel_path);
    }

    return fn;
}